

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall
QOpenGL2PaintEngineExPrivate::transferMode(QOpenGL2PaintEngineExPrivate *this,EngineMode newMode)

{
  QOpenGLEngineShaderManager *pQVar1;
  GLfloat *data;
  GLuint count;
  uint arrayIndex;
  
  if (this->mode == newMode) {
    return;
  }
  pQVar1 = this->shaderManager;
  if (newMode == TextDrawingMode) {
    pQVar1->shaderProgNeedsChanging = true;
    pQVar1->complexGeometry = true;
    goto LAB_0013fe2e;
  }
  pQVar1->shaderProgNeedsChanging = true;
  pQVar1->complexGeometry = false;
  if (newMode == ImageDrawingMode) {
    count = 8;
    uploadData(this,0,this->staticVertexCoordinateArray,8);
    data = this->staticTextureCoordinateArray;
    arrayIndex = 1;
LAB_0013fe1b:
    uploadData(this,arrayIndex,data,count);
  }
  else if (newMode - ImageArrayDrawingMode < 2) {
    uploadData(this,0,&((this->vertexCoordinateArray).vertexArray.buffer)->x,
               (int)(this->vertexCoordinateArray).vertexArray.siz * 2);
    uploadData(this,1,&((this->textureCoordinateArray).vertexArray.buffer)->x,
               (int)(this->textureCoordinateArray).vertexArray.siz * 2);
    if (newMode == ImageOpacityArrayDrawingMode) {
      data = (this->opacityArray).buffer;
      count = (GLuint)(this->opacityArray).siz;
      arrayIndex = 2;
      goto LAB_0013fe1b;
    }
  }
  QOpenGLEngineShaderManager::setMaskType((QOpenGLEngineShaderManager *)this->shaderManager,NoMask);
LAB_0013fe2e:
  this->mode = newMode;
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::transferMode(EngineMode newMode)
{
    if (newMode == mode)
        return;

    if (newMode == TextDrawingMode) {
        shaderManager->setHasComplexGeometry(true);
    } else {
        shaderManager->setHasComplexGeometry(false);
    }

    if (newMode == ImageDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
        uploadData(QT_TEXTURE_COORDS_ATTR, staticTextureCoordinateArray, 8);
    }

    if (newMode == ImageArrayDrawingMode || newMode == ImageOpacityArrayDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
        uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);

        if (newMode == ImageOpacityArrayDrawingMode)
            uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());
    }

    // This needs to change when we implement high-quality anti-aliasing...
    if (newMode != TextDrawingMode)
        shaderManager->setMaskType(QOpenGLEngineShaderManager::NoMask);

    mode = newMode;
}